

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_exec(opj_j2k_t *p_j2k,opj_procedure_list_t *p_procedure_list,
                     opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  int iVar2;
  opj_procedure *pp_Var3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  
  if (p_procedure_list == (opj_procedure_list_t *)0x0) {
    __assert_fail("p_procedure_list != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1fa0,
                  "OPJ_BOOL opj_j2k_exec(opj_j2k_t *, opj_procedure_list_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1fa1,
                  "OPJ_BOOL opj_j2k_exec(opj_j2k_t *, opj_procedure_list_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1fa2,
                  "OPJ_BOOL opj_j2k_exec(opj_j2k_t *, opj_procedure_list_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1fa3,
                  "OPJ_BOOL opj_j2k_exec(opj_j2k_t *, opj_procedure_list_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  OVar1 = opj_procedure_list_get_nb_procedures(p_procedure_list);
  pp_Var3 = opj_procedure_list_get_first_procedure(p_procedure_list);
  if (OVar1 == 0) {
    uVar4 = 1;
  }
  else {
    uVar4 = 1;
    lVar5 = 0;
    do {
      bVar6 = uVar4 != 0;
      uVar4 = 0;
      if (bVar6) {
        iVar2 = (*pp_Var3[lVar5])(p_j2k,p_stream,p_manager);
        uVar4 = (uint)(iVar2 != 0);
      }
      lVar5 = lVar5 + 1;
    } while (OVar1 != (OPJ_UINT32)lVar5);
  }
  opj_procedure_list_clear(p_procedure_list);
  return uVar4;
}

Assistant:

static OPJ_BOOL opj_j2k_exec(opj_j2k_t * p_j2k,
                             opj_procedure_list_t * p_procedure_list,
                             opj_stream_private_t *p_stream,
                             opj_event_mgr_t * p_manager)
{
    OPJ_BOOL(** l_procedure)(opj_j2k_t *, opj_stream_private_t *,
                             opj_event_mgr_t *) = 00;
    OPJ_BOOL l_result = OPJ_TRUE;
    OPJ_UINT32 l_nb_proc, i;

    /* preconditions*/
    assert(p_procedure_list != 00);
    assert(p_j2k != 00);
    assert(p_stream != 00);
    assert(p_manager != 00);

    l_nb_proc = opj_procedure_list_get_nb_procedures(p_procedure_list);
    l_procedure = (OPJ_BOOL(**)(opj_j2k_t *, opj_stream_private_t *,
                                opj_event_mgr_t *)) opj_procedure_list_get_first_procedure(p_procedure_list);

    for (i = 0; i < l_nb_proc; ++i) {
        l_result = l_result && ((*l_procedure)(p_j2k, p_stream, p_manager));
        ++l_procedure;
    }

    /* and clear the procedure list at the end.*/
    opj_procedure_list_clear(p_procedure_list);
    return l_result;
}